

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::PopFocusScope(void)

{
  int iVar1;
  ImGuiContext *pIVar2;
  
  pIVar2 = GImGui;
  iVar1 = (GImGui->FocusScopeStack).Size;
  if (0 < (long)iVar1) {
    (GImGui->CurrentWindow->DC).NavFocusScopeIdCurrent =
         (GImGui->FocusScopeStack).Data[(long)iVar1 + -1];
    (pIVar2->FocusScopeStack).Size = iVar1 + -1;
    return;
  }
  __assert_fail("g.FocusScopeStack.Size > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                ,0x1b45,"void ImGui::PopFocusScope()");
}

Assistant:

void ImGui::PopFocusScope()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    IM_ASSERT(g.FocusScopeStack.Size > 0); // Too many PopFocusScope() ?
    window->DC.NavFocusScopeIdCurrent = g.FocusScopeStack.back();
    g.FocusScopeStack.pop_back();
}